

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertToNLCon<mp::LinTerms,mp::AlgConRange>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *con,int param_3)

{
  double dVar1;
  double dVar2;
  AlgConRange rng_00;
  undefined1 uVar3;
  bool bVar4;
  bool bVar5;
  Arguments *pAVar6;
  size_t sVar7;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *in_RSI;
  long in_RDI;
  AlgConRange AVar8;
  NLConstraint nlc;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> lc;
  bool need_nlc;
  int exprResVar;
  AlgConRange rng;
  LinearFunctionalConstraint exprTerm;
  LinTerms lt;
  undefined1 in_stack_000009ef;
  LinTerms *in_stack_000009f0;
  NLConstraint *in_stack_fffffffffffff9a8;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff9b0;
  LinTerms *in_stack_fffffffffffff9b8;
  LinTerms *in_stack_fffffffffffff9c0;
  undefined7 in_stack_fffffffffffff9c8;
  undefined1 in_stack_fffffffffffff9cf;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *in_stack_fffffffffffff9d0;
  AlgConRange *this_00;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  CtxVal local_5d4;
  undefined1 in_stack_fffffffffffffa53;
  int in_stack_fffffffffffffa54;
  Arguments *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa64;
  undefined4 in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa6c;
  undefined7 in_stack_fffffffffffffa70;
  undefined1 local_538 [96];
  LinTerms *in_stack_fffffffffffffb28;
  LinTerms *in_stack_fffffffffffffb30;
  Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffb38;
  undefined4 local_184;
  AlgConRange local_180;
  AlgConRange local_170;
  AlgConRange local_160 [20];
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff9b0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetBody(local_18);
  Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ExtractLinAndExprArgs
            (in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  AVar8 = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetRhsOrRange(local_18);
  local_170.ub_ = AVar8.ub_;
  local_170.lb_ = AVar8.lb_;
  dVar1 = AlgConRange::lb(&local_170);
  AVar8 = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetRhsOrRange(local_18);
  local_180.ub_ = AVar8.ub_;
  local_180.lb_ = AVar8.lb_;
  dVar2 = AlgConRange::ub(&local_180);
  AlgConRange::AlgConRange(local_160,dVar1,dVar2);
  local_184 = -1;
  LinearFunctionalConstraint::GetArguments((LinearFunctionalConstraint *)0x19a092);
  uVar3 = AlgebraicExpression<mp::LinTerms>::is_variable
                    ((AlgebraicExpression<mp::LinTerms> *)in_stack_fffffffffffff9b0);
  if ((bool)uVar3) {
    pAVar6 = LinearFunctionalConstraint::GetArguments((LinearFunctionalConstraint *)0x19a0cc);
    in_stack_fffffffffffffa68 = SUB84(pAVar6,0);
    in_stack_fffffffffffffa6c = (int)((ulong)pAVar6 >> 0x20);
    in_stack_fffffffffffffa64 = LinTerms::get_representing_variable((LinTerms *)0x19a0e3);
    local_184 = in_stack_fffffffffffffa64;
  }
  else {
    in_stack_fffffffffffffa58 =
         LinearFunctionalConstraint::GetArguments((LinearFunctionalConstraint *)0x19a13e);
    bVar4 = LinTerms::empty((LinTerms *)0x19a155);
    in_stack_fffffffffffffa54 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffa54);
    if (!bVar4) {
      dVar1 = AlgConRange::lb(local_160);
      dVar2 = BasicFlatConverter::PracticallyMinusInf();
      if (dVar1 <= dVar2) {
        local_5d4 = CTX_NEG;
      }
      else {
        dVar1 = AlgConRange::ub(local_160);
        dVar2 = BasicFlatConverter::PracticallyInf();
        local_5d4 = CTX_POS;
        if (dVar1 < dVar2) {
          local_5d4 = CTX_MIX;
        }
      }
      Context::Context((Context *)&stack0xfffffffffffffe78,local_5d4);
      FunctionalConstraint::AddContext
                ((FunctionalConstraint *)in_stack_fffffffffffff9a8,
                 (Context)(CtxVal)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
      local_184 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::AssignResultVar2Args<mp::LinearFunctionalConstraint>
                            (in_stack_fffffffffffff9d8,
                             (LinearFunctionalConstraint *)in_stack_fffffffffffff9d0);
    }
  }
  bVar4 = false;
  if (-1 < (int)local_184) {
    bVar5 = FlatModel<mp::DefaultFlatModelParams>::VarHasMarking
                      (&in_stack_fffffffffffff9b0->super_FlatModel<mp::DefaultFlatModelParams>,
                       (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    if (!bVar5) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression
                (&in_stack_fffffffffffff9b0->super_FlatModel<mp::DefaultFlatModelParams>,
                 (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    }
    bVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::UserAcceptsAndRecommends<mp::NLConstraint>
                      (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    if (!bVar5) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsResultVar
                (&in_stack_fffffffffffff9b0->super_FlatModel<mp::DefaultFlatModelParams>,
                 (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    }
    bVar5 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      (&in_stack_fffffffffffff9b0->super_FlatModel<mp::DefaultFlatModelParams>,
                       (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
    if (bVar5) {
      LinTerms::add_term(in_stack_fffffffffffff9c0,(double)in_stack_fffffffffffff9b8,
                         (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
      LinTerms::sort_terms(in_stack_000009f0,(bool)in_stack_000009ef);
      sVar7 = LinTerms::size((LinTerms *)0x19a374);
      if (sVar7 < 2) {
        this_00 = local_160;
        AlgConRange::lb(this_00);
        AlgConRange::ub(this_00);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::NarrowVarBounds((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)CONCAT17(uVar3,in_stack_fffffffffffffa70),in_stack_fffffffffffffa6c,
                          (double)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                          (double)in_stack_fffffffffffffa58);
        local_1 = 1;
        goto LAB_0019a6fb;
      }
      bVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::UserAcceptsAndRecommends<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                        (in_stack_fffffffffffff9b0,
                         (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)
                         in_stack_fffffffffffff9a8);
      if (bVar4) {
        LinTerms::LinTerms(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
        uVar3 = (undefined1)((ulong)in_stack_fffffffffffff9c0 >> 0x38);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetRhsOrRange(local_18);
        AVar8.ub_._0_4_ = in_stack_fffffffffffff9e0;
        AVar8.lb_ = (double)in_stack_fffffffffffff9d8;
        AVar8.ub_._4_4_ = in_stack_fffffffffffff9e4;
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
                  (in_stack_fffffffffffff9d0,
                   (LinTerms *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),AVar8,
                   (bool)uVar3);
        LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff9b0);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_fffffffffffff9b0,
                   (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_fffffffffffff9a8);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                  ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                   (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_fffffffffffff9d8);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_fffffffffffff9b0);
        local_1 = 1;
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_fffffffffffff9b0);
        goto LAB_0019a6fb;
      }
      bVar4 = true;
      local_184 = -1;
    }
  }
  if (((-1 < (int)local_184) ||
      (bVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
               ::UserAcceptsAndRecommends<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                         (in_stack_fffffffffffff9b0,
                          (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)
                          in_stack_fffffffffffff9a8), !bVar5)) || (bVar4)) {
    rng_00.lb_._4_4_ = in_stack_fffffffffffffa6c;
    rng_00.lb_._0_4_ = in_stack_fffffffffffffa68;
    rng_00.ub_._0_7_ = in_stack_fffffffffffffa70;
    rng_00.ub_._7_1_ = uVar3;
    NLConstraint::NLConstraint
              ((NLConstraint *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               &in_stack_fffffffffffffa58->super_LinTerms,in_stack_fffffffffffffa54,rng_00,
               (bool)in_stack_fffffffffffffa53);
    in_stack_fffffffffffff9b0 =
         (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *)local_538;
    NLConstraint::NLConstraint
              ((NLConstraint *)in_stack_fffffffffffff9b0,(NLConstraint *)(in_RDI + -0x208));
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddConstraint<mp::NLConstraint>
              ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
               (NLConstraint *)in_stack_fffffffffffff9d8);
    NLConstraint::~NLConstraint((NLConstraint *)in_stack_fffffffffffff9b0);
    local_1 = 1;
    NLConstraint::~NLConstraint((NLConstraint *)in_stack_fffffffffffff9b0);
  }
  else {
    local_1 = 0;
  }
LAB_0019a6fb:
  LinearFunctionalConstraint::~LinearFunctionalConstraint
            ((LinearFunctionalConstraint *)in_stack_fffffffffffff9b0);
  LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff9b0);
  return (bool)(local_1 & 1);
}

Assistant:

bool ConvertToNLCon(
      const AlgebraicConstraint<Body, RhsOrRange>& con, int ) {
    LinTerms lt;
    /// exprTerm will be a LinearFunctionalConstraint or a Quadratic...
    auto exprTerm = ExtractLinAndExprArgs(con.GetBody(), lt);
    assert(0.0 == exprTerm.GetArguments().constant_term());
    AlgConRange rng { con.GetRhsOrRange().lb(), con.GetRhsOrRange().ub() };
    /// Store full LFC only if it is not 1.0*var
    int exprResVar = -1;
    if (exprTerm.GetArguments().is_variable()) {
      exprResVar = exprTerm.GetArguments().get_representing_variable();
    } else if ( !exprTerm.GetArguments().empty() ) {  // has more terms, or coef != 1.0
      exprTerm.AddContext(                            // Context is compulsory
          rng.lb() > MPCD( PracticallyMinusInf() )    // Should not need to propagate
          ? (rng.ub() < MPCD( PracticallyInf() )
                ? Context::CTX_MIX : Context::CTX_POS)
              : Context::CTX_NEG);
      exprResVar = MPD( AssignResultVar2Args(std::move(exprTerm)) );
    }
    bool need_nlc {false};
    if (exprResVar >= 0) {                            // Some expressions are there
      if (!MPCD(VarHasMarking(exprResVar)))             // mark as expr if new
        MPD( MarkAsExpression(exprResVar) );
      if ( !MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) )
        MPD( MarkAsResultVar(exprResVar) );
      /// Exists and marked a variable
      if (MPCD( IsProperVar(exprResVar) )) {            // Not an expression after all
        lt.add_term(1.0, exprResVar);        // @todo When exprTerm was originally a var,
        lt.sort_terms();                     // this would reproduce the original con.
        if (lt.size()>1) {                              // ... has other variables
          if (MPCD( UserAcceptsAndRecommends(       // Accepts LinCon..
                  (const AlgebraicConstraint<LinTerms, RhsOrRange>*)nullptr) )) {
            AlgebraicConstraint<LinTerms, RhsOrRange> lc {lt, con.GetRhsOrRange(), false};
            MPD( AddConstraint( std::move(lc) ) );
            return true;
          }
          need_nlc = true;
        } else {         // single variable, its expression will be explicified
          MPD( NarrowVarBounds(exprResVar, rng.lb(), rng.ub()) );
          return true;
        }
        exprResVar = -1;                                // no expression
      }
    }
    if (0<=exprResVar                                   // either: have expression
        || !MPCD( UserAcceptsAndRecommends(         // or, not accepts source \a con
            (const AlgebraicConstraint<Body, RhsOrRange>*)nullptr) )
        || need_nlc) {                                  // or, other reason
      assert( MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) );
      NLConstraint nlc{lt, exprResVar, rng, false};     // false: no sort any more
      MPD( AddConstraint( std::move(nlc) ) );
      return true;
    }
    return false;
  }